

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O2

void __thiscall
yyml::nn::Variable<double>::Variable(Variable<double> *this,TensorShape *shape,string *name)

{
  _Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_> local_a8
  ;
  TensorShape local_90;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  TensorShape local_48;
  
  TensorShape::TensorShape(&local_48,shape);
  Tensor<double>::Tensor(&this->values_,&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_48.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  TensorShape::TensorShape(&local_90,shape);
  Tensor<double>::Tensor(&this->grads_,&local_90);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_90.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  Autograd<double>::Autograd
            (&this->autograd_,
             (vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_> *)
             &local_a8,this,(BackwardFunction<double> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::
  ~_Vector_base(&local_a8);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  return;
}

Assistant:

Variable(TensorShape shape, std::string name)
      : values_(shape),
        grads_(shape),
        autograd_({}, this, nullptr),
        name_(name) {}